

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void __thiscall F3DFloor::UpdateColormap(F3DFloor *this,FDynamicColormap **map)

{
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 fade;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  FDynamicColormap *pFVar1;
  FDynamicColormap *pFVar2;
  
  fade = (this->target->ColorMap->Fade).field_0.field_0;
  if ((((fade == (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0) &&
       ((this->model->ColorMap->Fade).field_0.d == 0)) || ((this->flags & 0x8000000) != 0)) ||
     (pFVar2 = this->model->ColorMap,
     fade == (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
             (pFVar2->Fade).field_0.d)) {
    pFVar2 = this->model->ColorMap;
  }
  else {
    pFVar1 = *map;
    color = (pFVar2->Color).field_0.field_0;
    if ((((anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
          (pFVar1->Color).field_0.d == color) &&
        ((anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
         (pFVar1->Fade).field_0.d == fade)) && (pFVar1->Desaturate == pFVar2->Desaturate)) {
      return;
    }
    pFVar2 = GetSpecialLights((PalEntry)color,(PalEntry)fade,pFVar2->Desaturate);
  }
  *map = pFVar2;
  return;
}

Assistant:

void F3DFloor::UpdateColormap(FDynamicColormap *&map)
{
	// If there's no fog in either model or target sector (or both have the same fog) this is easy and fast.
	if ((target->ColorMap->Fade == 0 && model->ColorMap->Fade == 0) || (flags & FF_FADEWALLS) ||
		target->ColorMap->Fade == model->ColorMap->Fade)
	{
		map = model->ColorMap;
	}
	else
	{
		// since rebuilding the map is not a cheap operation let's only do it if something really changed.
		if (map->Color != model->ColorMap->Color || map->Fade != target->ColorMap->Fade ||
			map->Desaturate != model->ColorMap->Desaturate)
		{
			map = GetSpecialLights(model->ColorMap->Color, target->ColorMap->Fade, model->ColorMap->Desaturate);
		}
	}
}